

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

void __thiscall QHttpThreadDelegate::finishedSlot(QHttpThreadDelegate *this)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QMetaTypeInterface *pQVar5;
  bool bVar6;
  int iVar7;
  NetworkError NVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  undefined1 local_b0 [32];
  undefined1 local_90 [24];
  undefined1 local_78 [48];
  QMetaTypeInterface *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    bVar6 = QHttpNetworkReply::readAnyAvailable(*(QHttpNetworkReply **)(this + 0x150));
    if (bVar6) {
      do {
        LOCK();
        **(int **)(this + 0x48) = **(int **)(this + 0x48) + 1;
        UNLOCK();
        QHttpNetworkReply::readAny
                  ((QByteArray *)(local_78 + 0x20),*(QHttpNetworkReply **)(this + 0x150));
        local_78._0_8_ = (QArrayData *)0x0;
        local_78._8_8_ = (QHttpNetworkRequestPrivate *)(local_78 + 0x20);
        QMetaObject::activate((QObject *)this,&staticMetaObject,10,(void **)local_78);
        if ((QArrayData *)local_78._32_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._32_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_78._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78._32_8_,1,0x10);
          }
        }
        bVar6 = QHttpNetworkReply::readAnyAvailable(*(QHttpNetworkReply **)(this + 0x150));
      } while (bVar6);
    }
    if (this[0x10] == (QHttpThreadDelegate)0x1) {
      QHttpNetworkReply::sslConfiguration((QHttpNetworkReply *)local_78);
      local_78._32_8_ = (QArrayData *)0x0;
      local_78._40_8_ = (QHttpNetworkRequestPrivate *)local_78;
      QMetaObject::activate((QObject *)this,&staticMetaObject,4,(void **)(local_78 + 0x20));
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)local_78);
    }
    iVar7 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
    if (399 < iVar7) {
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QVar9.m_data = (storage_type *)0x2a;
      QVar9.m_size = (qsizetype)(local_78 + 0x20);
      QString::fromLatin1(QVar9);
      local_78._0_8_ = local_78._32_8_;
      local_78._8_8_ = local_78._40_8_;
      local_78._16_8_ = local_48;
      QHttpNetworkRequest::url((QHttpNetworkRequest *)(local_b0 + 0x18));
      QUrl::toString((QString *)local_90,(QHttpNetworkRequest *)(local_b0 + 0x18),0);
      QHttpNetworkReply::reasonPhrase((QString *)local_b0,*(QHttpNetworkReply **)(this + 0x150));
      QString::arg<QString,QString>
                ((type *)(local_78 + 0x20),(QString *)local_78,(QString *)local_90,
                 (QString *)local_b0);
      pQVar5 = local_48;
      uVar4 = local_78._32_8_;
      uVar3 = local_78._8_8_;
      uVar2 = local_78._0_8_;
      local_78._32_8_ = local_78._0_8_;
      local_78._0_8_ = uVar4;
      local_78._8_8_ = local_78._40_8_;
      local_78._40_8_ = uVar3;
      local_48 = (QMetaTypeInterface *)local_78._16_8_;
      local_78._16_8_ = pQVar5;
      if ((QArrayData *)uVar2 != (QArrayData *)0x0) {
        LOCK();
        *(int *)uVar2 = *(int *)uVar2 + -1;
        UNLOCK();
        if (*(int *)uVar2 == 0) {
          QArrayData::deallocate((QArrayData *)uVar2,2,0x10);
        }
      }
      piVar1 = (int *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_b0._4_4_,local_b0._0_4_),2,0x10);
        }
      }
      if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_90._0_8_ = *(int *)local_90._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_90._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
        }
      }
      QUrl::~QUrl((QUrl *)(local_b0 + 0x18));
      iVar7 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
      QHttpNetworkRequest::url((QHttpNetworkRequest *)local_90);
      local_b0._0_4_ = statusCodeFromHttp(iVar7,(QUrl *)local_90);
      local_78._32_8_ = (QArrayData *)0x0;
      local_78._40_8_ = (QHttpNetworkRequestPrivate *)local_b0;
      local_48 = (QMetaTypeInterface *)local_78;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0xb,(void **)(local_78 + 0x20));
      QUrl::~QUrl((QUrl *)local_90);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_78._0_8_ = *(int *)local_78._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_78._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
    }
    bVar6 = QHttpNetworkRequest::isFollowRedirects((QHttpNetworkRequest *)(this + 0x20));
    if (bVar6) {
      bVar6 = QHttpNetworkReply::isRedirecting(*(QHttpNetworkReply **)(this + 0x150));
      if (bVar6) {
        QHttpNetworkReply::redirectUrl((QHttpNetworkReply *)local_90);
        NVar8 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
        QHttpNetworkReply::request((QHttpNetworkReply *)local_78);
        local_b0._24_4_ = QHttpNetworkRequest::redirectCount((QHttpNetworkRequest *)local_78);
        local_b0._24_4_ = local_b0._24_4_ + -1;
        local_48 = (QMetaTypeInterface *)local_b0;
        puStack_40 = local_b0 + 0x18;
        local_78._32_8_ = (QArrayData *)0x0;
        local_b0._0_4_ = NVar8;
        local_78._40_8_ = (QHttpNetworkRequestPrivate *)local_90;
        QMetaObject::activate((QObject *)this,&staticMetaObject,0xd,(void **)(local_78 + 0x20));
        QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)local_78);
        QUrl::~QUrl((QUrl *)local_90);
      }
    }
    QMetaObject::activate((QObject *)this,&staticMetaObject,0xc,(void **)0x0);
    local_78._32_8_ = 0;
    local_78._40_8_ = 0;
    local_48 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)(this + 0x150),"deleteLater",QueuedConnection,1,
               (void **)(local_78 + 0x20),(char **)(local_78 + 0x28),&local_48);
    local_78._32_8_ = (QArrayData *)0x0;
    local_78._40_8_ = (QHttpNetworkRequestPrivate *)0x0;
    local_48 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"deleteLater",QueuedConnection,1,(void **)(local_78 + 0x20),
               (char **)(local_78 + 0x28),&local_48);
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::finishedSlot()
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::finishedSlot() thread=" << QThread::currentThreadId() << "result=" << httpReply->statusCode();
#endif

    // If there is still some data left emit that now
    while (httpReply->readAnyAvailable()) {
        pendingDownloadData->fetchAndAddRelease(1);
        emit downloadData(httpReply->readAny());
    }

#ifndef QT_NO_SSL
    if (ssl)
        emit sslConfigurationChanged(httpReply->sslConfiguration());
#endif

    if (httpReply->statusCode() >= 400) {
            // it's an error reply
            QString msg = QLatin1StringView(QT_TRANSLATE_NOOP("QNetworkReply",
                                                              "Error transferring %1 - server replied: %2"));
            msg = msg.arg(httpRequest.url().toString(), httpReply->reasonPhrase());
            emit error(statusCodeFromHttp(httpReply->statusCode(), httpRequest.url()), msg);
        }

    if (httpRequest.isFollowRedirects() && httpReply->isRedirecting())
        emit redirected(httpReply->redirectUrl(), httpReply->statusCode(), httpReply->request().redirectCount() - 1);

    emit downloadFinished();

    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(this, "deleteLater", Qt::QueuedConnection);
    httpReply = nullptr;
}